

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CManager_conflict INT_CManager_create_control(char *control_module)

{
  __pid_t _Var1;
  int iVar2;
  CManager_conflict __s;
  CMPollFunc func;
  time_t tVar3;
  CMPollFunc file;
  long lVar4;
  char *pcVar5;
  CManager_conflict __s1;
  CMControlList p_Var6;
  CMincoming_format_list p_Var7;
  CMFormat *pp_Var8;
  _pending_format_requests *p_Var9;
  CMConnection_conflict *pp_Var10;
  char *in_RDI;
  CManager unaff_retaddr;
  char *c;
  char *tmp_1;
  char *tmp;
  uint64_t seed;
  int atom_init;
  CManager_conflict cm;
  CManager_conflict in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar11;
  char *local_10;
  undefined8 in_stack_fffffffffffffff8;
  CMTraceType trace_type;
  
  __s = (CManager_conflict)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
  iVar11 = 0;
  if (atl_mutex_initialized == 0) {
    atl_mutex_initialized = 1;
    pthread_mutex_init((pthread_mutex_t *)&atl_mutex,(pthread_mutexattr_t *)0x0);
    atl_install_mutex_funcs(atl_mutex_lock,atl_mutex_unlock,&atl_mutex);
  }
  if (__s == (CManager_conflict)0x0) {
    __s = (CManager_conflict)0x0;
  }
  else {
    memset(__s,0,0x150);
    if (iVar11 == 0) {
      CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
      CM_CMANAGER_ID = attr_atom_from_string("CM_CMANAGER_ID");
      CM_NETWORK_POSTFIX = attr_atom_from_string("CM_NETWORK_POSTFIX");
      CM_CONN_BLOCKING = attr_atom_from_string("CM_CONN_BLOCKING");
      CM_REBWM_RLEN = attr_atom_from_string("CM_REG_BW_RUN_LEN");
      CM_REBWM_REPT = attr_atom_from_string("CM_REG_BW_REPEAT_CNT");
      CM_BW_MEASURE_INTERVAL = attr_atom_from_string("CM_BW_MEASURE_INTERVAL");
      CM_BW_MEASURE_TASK = attr_atom_from_string("CM_BW_MEASURE_TASK");
      CM_BW_MEASURED_VALUE = attr_atom_from_string("CM_BW_MEASURED_VALUE");
      CM_BW_MEASURED_COF = attr_atom_from_string("CM_BW_MEASURED_COF");
      CM_BW_MEASURE_SIZE = attr_atom_from_string("CM_BW_MEASURE_SIZE");
      CM_BW_MEASURE_SIZEINC = attr_atom_from_string("CM_BW_MEASURE_SIZEINC");
      CM_EVENT_SIZE = attr_atom_from_string("CM_EVENT_SIZE");
      CM_INCOMING_CONNECTION = attr_atom_from_string("CM_INCOMING_CONNECTION");
      CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
      CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
    }
    __s->transports = (transport_entry_conflict *)0x0;
    __s->initialized = 0;
    __s->reference_count = 1;
    _Var1 = getpid();
    func = (CMPollFunc)(long)_Var1;
    tVar3 = time((time_t *)0x0);
    file = func + tVar3;
    srand48((long)file);
    lVar4 = lrand48();
    __s->CManager_ID = (int)lVar4;
    pcVar5 = getenv("CMControlModule");
    trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
    local_10 = in_RDI;
    if (pcVar5 != (char *)0x0) {
      local_10 = pcVar5;
    }
    if (local_10 != (char *)0x0) {
      __s1 = (CManager_conflict)strdup(local_10);
      for (in_stack_ffffffffffffffc0 = __s1;
          trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffff8 >> 0x20),
          *(char *)&in_stack_ffffffffffffffc0->transports != '\0';
          in_stack_ffffffffffffffc0 =
               (CManager_conflict)((long)&in_stack_ffffffffffffffc0->transports + 1)) {
        iVar2 = tolower((int)*(char *)&in_stack_ffffffffffffffc0->transports);
        *(char *)&in_stack_ffffffffffffffc0->transports = (char)iVar2;
      }
      iVar2 = strcmp((char *)__s1,"epoll");
      if (iVar2 == 0) {
        __s->control_module_choice = "epoll";
      }
      else {
        iVar2 = strcmp((char *)__s1,"select");
        if (iVar2 == 0) {
          __s->control_module_choice = "select";
        }
        else {
          fprintf(_stderr,
                  "Warning:  Specified CM/EVPath control module \"%s\" unknown or not built.\n",
                  local_10);
          local_10 = (char *)0x0;
        }
      }
      free(__s1);
    }
    iVar2 = (int)((ulong)pcVar5 >> 0x20);
    if (local_10 == (char *)0x0) {
      __s->control_module_choice = "epoll";
    }
    p_Var6 = CMControlList_create();
    __s->control_list = p_Var6;
    pthread_mutex_init((pthread_mutex_t *)&__s->exchange_lock,(pthread_mutexattr_t *)0x0);
    __s->locked = 0;
    __s->closed = 0;
    __s->abort_read_ahead = 0;
    __s->CMTrace_file = (FILE *)0x0;
    CMtrace_init(unaff_retaddr,trace_type);
    CMinit_local_formats(unaff_retaddr);
    pthread_mutex_init((pthread_mutex_t *)&__s->context_lock,(pthread_mutexattr_t *)0x0);
    __s->in_format_count = 0;
    p_Var7 = (CMincoming_format_list)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
    __s->in_formats = p_Var7;
    __s->reg_format_count = 0;
    pp_Var8 = (CMFormat *)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
    __s->reg_formats = pp_Var8;
    __s->pending_request_max = 1;
    p_Var9 = (_pending_format_requests *)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
    __s->pbio_requests = p_Var9;
    __s->pbio_requests->server_id = (char *)0x0;
    __s->pbio_requests->id_length = 0;
    __s->pbio_requests->condition = 0;
    __s->pbio_requests->top_request = 0;
    __s->connection_count = 0;
    pp_Var10 = (CMConnection_conflict *)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
    __s->connections = pp_Var10;
    __s->reg_user_format_count = 0;
    pp_Var8 = (CMFormat *)INT_CMmalloc((size_t)in_stack_ffffffffffffffc0);
    __s->reg_user_formats = pp_Var8;
    __s->cm_buffer_list = (CMbuffer)0x0;
    __s->pending_data_queue = (pending_queue)0x0;
    __s->contact_lists = (attr_list *)0x0;
    __s->shutdown_functions = (func_entry *)0x0;
    __s->perf_upcall = (CMperf_upcall)0x0;
    INT_CMadd_poll(in_stack_ffffffffffffffc0,func,(void *)0x11a829);
    IntCManager_lock((CManager)CONCAT44(iVar11,in_stack_ffffffffffffffe0),(char *)file,iVar2);
    EVPinit((CManager_conflict)CONCAT44(iVar11,in_stack_ffffffffffffffe0));
    IntCManager_unlock((CManager)CONCAT44(iVar11,in_stack_ffffffffffffffe0),(char *)file,iVar2);
  }
  return __s;
}

Assistant:

extern
CManager
INT_CManager_create_control(char *control_module)
{
    CManager cm = (CManager) INT_CMmalloc(sizeof(CManager_s));
    int atom_init = 0;

    if (!atl_mutex_initialized) {
	atl_mutex_initialized++;
	thr_mutex_init(atl_mutex);
	atl_install_mutex_funcs((atl_lock_func)atl_mutex_lock, (atl_lock_func)atl_mutex_unlock, 
				&atl_mutex);
    }
    if (cm == NULL)
	return NULL;
    memset(cm, 0, sizeof(CManager_s));

    if (atom_init == 0) {
	CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
	CM_CMANAGER_ID = attr_atom_from_string("CM_CMANAGER_ID");
	CM_NETWORK_POSTFIX = attr_atom_from_string("CM_NETWORK_POSTFIX");
	CM_CONN_BLOCKING = attr_atom_from_string("CM_CONN_BLOCKING");
	CM_REBWM_RLEN = attr_atom_from_string("CM_REG_BW_RUN_LEN");
	CM_REBWM_REPT = attr_atom_from_string("CM_REG_BW_REPEAT_CNT");
	CM_BW_MEASURE_INTERVAL = attr_atom_from_string("CM_BW_MEASURE_INTERVAL");
	CM_BW_MEASURE_TASK = attr_atom_from_string("CM_BW_MEASURE_TASK");
	CM_BW_MEASURED_VALUE = attr_atom_from_string("CM_BW_MEASURED_VALUE");
	CM_BW_MEASURED_COF = attr_atom_from_string("CM_BW_MEASURED_COF");
	CM_BW_MEASURE_SIZE = attr_atom_from_string("CM_BW_MEASURE_SIZE");
	CM_BW_MEASURE_SIZEINC = attr_atom_from_string("CM_BW_MEASURE_SIZEINC");
	CM_EVENT_SIZE = attr_atom_from_string("CM_EVENT_SIZE");
	CM_INCOMING_CONNECTION = attr_atom_from_string("CM_INCOMING_CONNECTION");
	CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
	CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
    }

    /* initialize data structs */
    cm->transports = NULL;
    cm->initialized = 0;
    cm->reference_count = 1;
    uint64_t seed = getpid() + time(NULL);
    srand48(seed);
    cm->CManager_ID = (int)lrand48();

    char *tmp;
    if ((tmp = getenv("CMControlModule"))) {
	control_module = tmp;
    }

    if (control_module != NULL) {
	char *tmp = strdup(control_module);
	char *c;
	for (c = tmp; *c; ++c) *c = tolower(*c);
#ifdef HAVE_SYS_EPOLL_H
	if (strcmp(tmp, "epoll") == 0) {
	    cm->control_module_choice = "epoll";
	} else
#endif
	if (strcmp(tmp, "select") == 0) {
	    cm->control_module_choice = "select";
	} else {
	    fprintf(stderr, "Warning:  Specified CM/EVPath control module \"%s\" unknown or not built.\n", control_module);
	    /* force to default */
	    control_module = NULL;
	}
	free(tmp);
    }	
    if (control_module == NULL) {
#ifdef HAVE_SYS_EPOLL_H
	cm->control_module_choice = "epoll";
#else
	cm->control_module_choice = "select";
#endif
    }
    cm->control_list = CMControlList_create();
    thr_mutex_init(cm->exchange_lock);

    cm->locked = 0;
    cm->closed = 0;
    cm->abort_read_ahead = 0;
    cm->CMTrace_file = NULL;
    CMtrace_init(cm, EVerbose);
    CMinit_local_formats(cm);
    thr_mutex_init(cm->context_lock);

    cm->in_format_count = 0;
    cm->in_formats = INT_CMmalloc(1);

    cm->reg_format_count = 0;
    cm->reg_formats = INT_CMmalloc(1);

    cm->pending_request_max = 1;
    cm->pbio_requests = INT_CMmalloc(sizeof(struct _pending_format_requests));
    cm->pbio_requests[0].server_id = NULL;
    cm->pbio_requests[0].id_length = 0;
    cm->pbio_requests[0].condition = 0;
    cm->pbio_requests[0].top_request = 0;

    cm->connection_count = 0;
    cm->connections = INT_CMmalloc(1);
    cm->reg_user_format_count = 0;
    cm->reg_user_formats = INT_CMmalloc(1);
    cm->cm_buffer_list = NULL;
    cm->pending_data_queue = NULL;

    cm->contact_lists = NULL;
    cm->shutdown_functions = NULL;
    cm->perf_upcall = NULL;
    INT_CMadd_poll(cm, process_pending_queue, NULL);
#ifdef EV_INTERNAL_H
    CManager_lock(cm);
    EVPinit(cm);
    CManager_unlock(cm);
#endif
    return cm;
}